

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O1

void OPSG_SetMuteMask(void *chip,UINT32 MuteMask)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = 0;
  do {
    uVar2 = MuteMask >> ((byte)lVar1 & 0x1f);
    *(byte *)((long)chip + lVar1 + 0x650) = (byte)uVar2 & 1;
    if ((uVar2 & 1) != 0) {
      *(undefined4 *)((long)chip + lVar1 * 4 + 0x5e0) = 0;
      *(undefined4 *)((long)chip + lVar1 * 4 + 0x600) = 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  return;
}

Assistant:

static void OPSG_SetMuteMask(void* chip, UINT32 MuteMask)
{
	Uint8 CurChn;
	
	for (CurChn = 0; CurChn < N_CHANNEL; CurChn ++)
		OPSG_SetMutePsgChannel(chip, CurChn, (MuteMask >> CurChn) & 0x01);
	
	return;
}